

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

int opengv::absolute_pose::modules::gpnp1::init(EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *in_RDX;
  double *in_RSI;
  double dVar11;
  double dVar12;
  double dVar14;
  double dVar15;
  undefined1 auVar13 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 in_ZMM10 [64];
  Vector3d temp;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_60;
  double local_48;
  double dStack_40;
  double local_38;
  
  auVar17 = in_ZMM10._0_16_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_48,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_60);
  dVar11 = local_48 * local_48;
  dVar14 = dStack_40 * dStack_40;
  dVar7 = local_38 * local_38;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&local_48,&local_60);
  dVar12 = local_48 * local_48;
  dVar15 = dStack_40 * dStack_40;
  dVar8 = local_38 * local_38;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&local_48,&local_60);
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[4];
  dVar4 = in_RDX[3];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar4;
  dVar5 = in_RDX[5];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar5;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  auVar13 = vsqrtsd_avx(auVar16,auVar16);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar2 * -2.0;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar1 * -2.0 * dVar3;
  auVar10 = vfmadd231sd_fma(auVar103,auVar76,auVar57);
  dVar6 = in_RDX[2];
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar6 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar113,auVar107,auVar10);
  *(double *)ctx =
       dVar5 * dVar5 +
       dVar6 * dVar6 + dVar3 * dVar3 + dVar1 * dVar1 + dVar4 * dVar4 + auVar10._0_8_ + dVar2 * dVar2
  ;
  dVar1 = *in_RSI;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = in_RDX[3];
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *in_RDX;
  dVar2 = in_RSI[1];
  auVar104._8_8_ = 0;
  auVar104._0_8_ = in_RDX[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1 * -2.0 * in_RDX[3];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar1 + dVar1;
  auVar10 = vfmadd231sd_fma(auVar20,auVar94,auVar58);
  dVar1 = in_RSI[3];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar1;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *in_RDX * -2.0;
  auVar10 = vfmadd213sd_fma(auVar95,auVar59,auVar10);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar1 + dVar1;
  auVar10 = vfmadd213sd_fma(auVar21,auVar77,auVar10);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar2 + dVar2;
  auVar10 = vfmadd213sd_fma(auVar60,auVar104,auVar10);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = in_RDX[4];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar2 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar44,auVar22,auVar10);
  dVar1 = in_RSI[4];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar1;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = in_RDX[1] * -2.0;
  auVar10 = vfmadd213sd_fma(auVar78,auVar61,auVar10);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar1 + dVar1;
  auVar10 = vfmadd213sd_fma(auVar45,auVar22,auVar10);
  dVar1 = in_RSI[2];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = in_RDX[2];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar1 + dVar1;
  auVar10 = vfmadd213sd_fma(auVar62,auVar79,auVar10);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = in_RDX[5];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar23,auVar46,auVar10);
  dVar1 = in_RSI[5];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar1;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = in_RDX[2] * -2.0;
  auVar10 = vfmadd213sd_fma(auVar80,auVar63,auVar10);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar24,auVar46,auVar10);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7 + dVar11 + dVar14;
  auVar10 = vsqrtsd_avx(auVar17,auVar10);
  *(long *)(ctx + 0x28) = auVar9._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[3];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar3;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1 * -2.0;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar1 * dVar1 - auVar10._0_8_ * auVar10._0_8_;
  auVar10 = vfmadd213sd_fma(auVar25,auVar81,auVar64);
  dVar1 = in_RSI[4];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2 * dVar2 + dVar3 * dVar3 + auVar10._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar2 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar47,auVar65,auVar26);
  dVar2 = in_RSI[2];
  dVar3 = in_RSI[5];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar3;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar2 * dVar2 + dVar1 * dVar1 + auVar10._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar2 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar48,auVar66,auVar27);
  *(double *)(ctx + 0x50) = dVar3 * dVar3 + auVar10._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[7];
  dVar4 = in_RDX[6];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar4;
  dVar5 = in_RDX[8];
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar5;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar2 * -2.0;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar1 * -2.0 * dVar3;
  auVar10 = vfmadd231sd_fma(auVar105,auVar82,auVar67);
  dVar6 = in_RDX[2];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar6 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar114,auVar108,auVar10);
  *(double *)(ctx + 8) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar10._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *in_RDX;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = in_RDX[2];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar2 + dVar2;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = (dVar1 + dVar1) * in_RDX[1];
  auVar10 = vfmadd231sd_fma(auVar83,auVar96,auVar68);
  dVar3 = in_RSI[2];
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar3 + dVar3;
  auVar10 = vfmadd213sd_fma(auVar109,auVar115,auVar10);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = in_RDX[6];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar28,auVar84,auVar10);
  dVar2 = in_RSI[6];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = dVar2;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *in_RDX * -2.0;
  auVar10 = vfmadd213sd_fma(auVar97,auVar110,auVar10);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2 + dVar2;
  auVar10 = vfmadd213sd_fma(auVar29,auVar84,auVar10);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = in_RDX[7];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar1 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar49,auVar85,auVar10);
  dVar1 = in_RSI[7];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = in_RDX[1] * -2.0;
  auVar10 = vfmadd213sd_fma(auVar98,auVar30,auVar10);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = in_RDX[8];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1 + dVar1;
  auVar10 = vfmadd213sd_fma(auVar31,auVar85,auVar10);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar3 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar69,auVar50,auVar10);
  dVar1 = in_RSI[8];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = in_RDX[2] * -2.0;
  auVar10 = vfmadd213sd_fma(auVar86,auVar32,auVar10);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1 + dVar1;
  auVar16 = vfmadd213sd_fma(auVar33,auVar50,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar8 + dVar12 + dVar15;
  auVar10 = vsqrtsd_avx(ZEXT816(0xc000000000000000),auVar9);
  *(long *)(ctx + 0x30) = auVar16._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[6];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar4;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1 * -2.0;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = (dVar1 * dVar1 - auVar10._0_8_ * auVar10._0_8_) + dVar2 * dVar2 + dVar3 * dVar3;
  auVar10 = vfmadd213sd_fma(auVar34,auVar99,auVar70);
  dVar1 = in_RSI[7];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar4 * dVar4 + auVar10._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar2 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar51,auVar71,auVar35);
  dVar2 = in_RSI[8];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1 * dVar1 + auVar10._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar3 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar72,auVar52,auVar36);
  *(double *)(ctx + 0x58) = dVar2 * dVar2 + auVar10._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[10];
  dVar4 = in_RDX[9];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar4;
  dVar5 = in_RDX[0xb];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar5;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar2 * -2.0;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar1 * -2.0 * dVar3;
  auVar10 = vfmadd231sd_fma(auVar106,auVar87,auVar73);
  dVar6 = in_RDX[2];
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar6 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar116,auVar111,auVar10);
  *(double *)(ctx + 0x10) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar10._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *in_RDX;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = in_RDX[2];
  dVar3 = in_RSI[9];
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar3;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar2 + dVar2;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = (dVar1 + dVar1) * in_RDX[1];
  auVar10 = vfmadd231sd_fma(auVar88,auVar100,auVar74);
  dVar4 = in_RSI[2];
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar4 + dVar4;
  auVar10 = vfmadd213sd_fma(auVar112,auVar117,auVar10);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = in_RDX[9];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar2 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar37,auVar89,auVar10);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *in_RDX * -2.0;
  auVar10 = vfmadd213sd_fma(auVar101,auVar118,auVar10);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar3 + dVar3;
  auVar10 = vfmadd213sd_fma(auVar38,auVar89,auVar10);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = in_RDX[10];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar1 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar53,auVar90,auVar10);
  dVar1 = in_RSI[10];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = in_RDX[1] * -2.0;
  auVar10 = vfmadd213sd_fma(auVar102,auVar39,auVar10);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = in_RDX[0xb];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1 + dVar1;
  auVar10 = vfmadd213sd_fma(auVar40,auVar90,auVar10);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar4 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar75,auVar54,auVar10);
  dVar1 = in_RSI[0xb];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = in_RDX[2] * -2.0;
  auVar10 = vfmadd213sd_fma(auVar91,auVar41,auVar10);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1 + dVar1;
  auVar10 = vfmadd213sd_fma(auVar42,auVar54,auVar10);
  *(long *)(ctx + 0x38) = auVar10._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[9];
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar4;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (dVar1 * dVar1 - auVar13._0_8_ * auVar13._0_8_) + dVar2 * dVar2 + dVar3 * dVar3;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar1 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar43,auVar92,auVar17);
  dVar1 = in_RSI[10];
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar4 * dVar4 + auVar10._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar2 * -2.0;
  auVar10 = vfmadd213sd_fma(auVar55,auVar93,auVar18);
  dVar2 = in_RSI[0xb];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3 * -2.0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1 * dVar1 + auVar10._0_8_;
  auVar10 = vfmadd213sd_fma(auVar13,auVar56,auVar19);
  *(double *)(ctx + 0x60) = dVar2 * dVar2 + auVar10._0_8_;
  return (int)ctx;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp1::init(
    Eigen::Matrix<double,5,3> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();

  groebnerMatrix(0,0) = -2*n(0,0)*n(3,0)-2*n(1,0)*n(4,0)-2*n(2,0)*n(5,0)+pow(n(0,0),2)+pow(n(3,0),2)+pow(n(1,0),2)+pow(n(4,0),2)+pow(n(2,0),2)+pow(n(5,0),2);
  groebnerMatrix(0,1) = 2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0)-2*n(0,0)*a(3,0)+2*a(3,0)*n(3,0)+2*a(1,0)*n(1,0)-2*a(1,0)*n(4,0)-2*n(1,0)*a(4,0)+2*a(4,0)*n(4,0)+2*a(2,0)*n(2,0)-2*a(2,0)*n(5,0)-2*n(2,0)*a(5,0)+2*a(5,0)*n(5,0);
  groebnerMatrix(0,2) = -c01w+pow(a(0,0),2)-2*a(0,0)*a(3,0)+pow(a(3,0),2)+pow(a(1,0),2)-2*a(1,0)*a(4,0)+pow(a(4,0),2)+pow(a(2,0),2)-2*a(2,0)*a(5,0)+pow(a(5,0),2);
  groebnerMatrix(1,0) = -2*n(0,0)*n(6,0)-2*n(1,0)*n(7,0)-2*n(2,0)*n(8,0)+pow(n(0,0),2)+pow(n(1,0),2)+pow(n(2,0),2)+pow(n(6,0),2)+pow(n(7,0),2)+pow(n(8,0),2);
  groebnerMatrix(1,1) = 2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0)+2*a(2,0)*n(2,0)-2*a(0,0)*n(6,0)-2*n(0,0)*a(6,0)+2*a(6,0)*n(6,0)-2*a(1,0)*n(7,0)-2*n(1,0)*a(7,0)+2*a(7,0)*n(7,0)-2*a(2,0)*n(8,0)-2*n(2,0)*a(8,0)+2*a(8,0)*n(8,0);
  groebnerMatrix(1,2) = -c02w+pow(a(0,0),2)+pow(a(1,0),2)+pow(a(2,0),2)-2*a(0,0)*a(6,0)+pow(a(6,0),2)-2*a(1,0)*a(7,0)+pow(a(7,0),2)-2*a(2,0)*a(8,0)+pow(a(8,0),2);
  groebnerMatrix(2,0) = -2*n(0,0)*n(9,0)-2*n(1,0)*n(10,0)-2*n(2,0)*n(11,0)+pow(n(0,0),2)+pow(n(1,0),2)+pow(n(2,0),2)+pow(n(9,0),2)+pow(n(10,0),2)+pow(n(11,0),2);
  groebnerMatrix(2,1) = 2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0)+2*a(2,0)*n(2,0)-2*a(0,0)*n(9,0)-2*n(0,0)*a(9,0)+2*a(9,0)*n(9,0)-2*a(1,0)*n(10,0)-2*n(1,0)*a(10,0)+2*a(10,0)*n(10,0)-2*a(2,0)*n(11,0)-2*n(2,0)*a(11,0)+2*a(11,0)*n(11,0);
  groebnerMatrix(2,2) = -c03w+pow(a(0,0),2)+pow(a(1,0),2)+pow(a(2,0),2)-2*a(0,0)*a(9,0)+pow(a(9,0),2)-2*a(1,0)*a(10,0)+pow(a(10,0),2)-2*a(2,0)*a(11,0)+pow(a(11,0),2);
}